

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  long *plVar2;
  LogMessage *pLVar3;
  long lVar4;
  long lVar5;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x66);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: rep_: ");
    LogFinisher::operator=((LogFinisher *)&local_90,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x67);
    pLVar3 = LogMessage::operator<<(&local_90,"CHECK failed: arena_ == nullptr: ");
    LogFinisher::operator=(&local_91,pLVar3);
    LogMessage::~LogMessage(&local_90);
  }
  pRVar1 = this->rep_;
  lVar5 = (long)pRVar1->allocated_size;
  if (0 < lVar5) {
    lVar4 = 0;
    do {
      plVar2 = (long *)pRVar1->elements[lVar4];
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  operator_delete(this->rep_);
  this->rep_ = (Rep *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  GOOGLE_DCHECK(rep_);
  GOOGLE_DCHECK(arena_ == nullptr);
  int n = rep_->allocated_size;
  void* const* elements = rep_->elements;
  for (int i = 0; i < n; i++) {
    delete static_cast<MessageLite*>(elements[i]);
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
  ::operator delete(static_cast<void*>(rep_), size);
  rep_ = nullptr;
#else
  ::operator delete(static_cast<void*>(rep_));
  rep_ = nullptr;
#endif
}